

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

uint32_t __thiscall TldAsKey::Hash(TldAsKey *this)

{
  uint32_t uVar1;
  size_t i;
  size_t sVar2;
  
  uVar1 = this->hash;
  if (uVar1 == 0) {
    this->hash = 0xbabac001;
    uVar1 = 0xbabac001;
    for (sVar2 = 0; this->tld_len != sVar2; sVar2 = sVar2 + 1) {
      uVar1 = (uint)this->tld[sVar2] + uVar1 * 0x65;
      this->hash = uVar1;
    }
  }
  return uVar1;
}

Assistant:

uint32_t TldAsKey::Hash()
{
    if (hash == 0)
    {
        hash = 0xBABAC001;

        for (size_t i = 0; i < tld_len; i++)
        {
            hash = hash * 101 + tld[i];
        }
    }

    return hash;
}